

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testRenameChannel(void)

{
  int iVar1;
  int iVar2;
  ostream *this;
  TypedDeepImageChannel<Imath_3_2::half> *pTVar3;
  bool caught;
  DeepImageLevel *level_1;
  int i_1;
  DeepImageLevel *level;
  int i;
  DeepImage img;
  Vec2<int> *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffc30;
  allocator<char> *in_stack_fffffffffffffc50;
  TypedDeepImageChannel<Imath_3_2::half> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  int local_1b8;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  undefined8 local_f0;
  int local_e8;
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  Vec2<int> local_88;
  Vec2<int> local_80;
  Box local_78 [16];
  DeepImage local_68 [104];
  
  this = std::operator<<((ostream *)&std::cout,"channel renaming");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_80,0xf,0x14);
  Imath_3_2::Vec2<int>::Vec2(&local_88,0x2d,0x3c);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffc30,(Vec2<int> *)in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc20);
  Imf_3_4::DeepImage::DeepImage(local_68,local_78,MIPMAP_LEVELS,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  Imf_3_4::Image::insertChannel((string *)local_68,(PixelType)local_a8,1,1,true);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  Imf_3_4::Image::insertChannel((string *)local_68,(PixelType)local_e0,1,1,true);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  local_e8 = 0;
  while( true ) {
    iVar1 = local_e8;
    iVar2 = Imf_3_4::Image::numLevels();
    if (iVar2 <= iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 in_stack_fffffffffffffc50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 in_stack_fffffffffffffc50);
      Imf_3_4::Image::renameChannel((string *)local_68,local_188);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      local_1b8 = 0;
      while( true ) {
        iVar1 = local_1b8;
        iVar2 = Imf_3_4::Image::numLevels();
        if (iVar2 <= iVar1) {
          local_232 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     in_stack_fffffffffffffc50);
          Imf_3_4::Image::renameChannel((string *)local_68,local_258);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator(&local_259);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x238,"void (anonymous namespace)::testRenameChannel()");
        }
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    Imf_3_4::DeepImage::level((int)local_68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50);
        pTVar3 = Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                           ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        if (pTVar3 != (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
          __assert_fail("level.findTypedChannel<half> (\"A\") == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x22e,"void (anonymous namespace)::testRenameChannel()");
        }
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        in_stack_fffffffffffffc60 = local_1c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc58 =
             Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        if (in_stack_fffffffffffffc58 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
          __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x22f,"void (anonymous namespace)::testRenameChannel()");
        }
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator(&local_209);
        in_stack_fffffffffffffc50 = &local_231;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50);
        pTVar3 = Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                           ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        if (pTVar3 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) break;
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_231);
        local_1b8 = local_1b8 + 1;
      }
      __assert_fail("level.findTypedChannel<half> (\"C\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x230,"void (anonymous namespace)::testRenameChannel()");
    }
    local_f0 = Imf_3_4::DeepImage::level((int)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
              );
    pTVar3 = Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    if (pTVar3 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
      __assert_fail("level.findTypedChannel<half> (\"A\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x224,"void (anonymous namespace)::testRenameChannel()");
    }
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
              );
    pTVar3 = Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    if (pTVar3 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) break;
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
              );
    pTVar3 = Imf_3_4::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    if (pTVar3 != (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
      __assert_fail("level.findTypedChannel<half> (\"C\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x226,"void (anonymous namespace)::testRenameChannel()");
    }
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    local_e8 = local_e8 + 1;
  }
  __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                ,0x225,"void (anonymous namespace)::testRenameChannel()");
}

Assistant:

void
testRenameChannel ()
{
    cout << "renaming a single channel" << endl;

    FlatImage img (Box2i (V2i (15, 20), V2i (45, 60)), MIPMAP_LEVELS);
    img.insertChannel ("A", HALF);
    img.insertChannel ("B", HALF);

    for (int i = 0; i < img.numLevels (); ++i)
    {
        const FlatImageLevel& level = img.level (i);
        assert (level.findTypedChannel<half> ("A") != 0);
        assert (level.findTypedChannel<half> ("B") != 0);
        assert (level.findTypedChannel<half> ("C") == 0);
    }

    img.renameChannel ("A", "C");

    for (int i = 0; i < img.numLevels (); ++i)
    {
        const FlatImageLevel& level = img.level (i);
        assert (level.findTypedChannel<half> ("A") == 0);
        assert (level.findTypedChannel<half> ("B") != 0);
        assert (level.findTypedChannel<half> ("C") != 0);
    }

    bool caught = false;

    try
    {
        img.renameChannel ("A", "D"); // "A" doesn't exist
        assert (false);
    }
    catch (...)
    {
        // expecting exception
        caught = true;
    }
    assert (caught);

    caught = false;
    try
    {
        img.renameChannel ("C", "B"); // "B" exists already
        assert (false);
    }
    catch (...)
    {
        // expecting exception
        caught = true;
    }
    assert (caught);
}